

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
VW::config::
typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
default_value(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *__return_storage_ptr__,
             typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  element_type *peVar1;
  
  peVar1 = (this->m_default_value).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)peVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T default_value() { return m_default_value ? *m_default_value : T(); }